

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_init_arith(bitstream *str,h264_cabac_context *cabac)

{
  int iVar1;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  if (cabac == (h264_cabac_context *)0x0) {
    str_local._4_4_ = 0;
  }
  else if (str->bitpos == 7) {
    if (str->dir == VS_ENCODE) {
      cabac->codIRange = 0x1fe;
      cabac->codIOffset = 0;
      cabac->firstBitFlag = 1;
      cabac->bitsOutstanding = 0;
    }
    else {
      cabac->codIRange = 0x1fe;
      iVar1 = vs_u(str,&cabac->codIOffset,9);
      if (iVar1 != 0) {
        return 1;
      }
      if (0x1fd < cabac->codIOffset) {
        fprintf(_stderr,"Initial codIOffset >= 510\n");
        return 1;
      }
    }
    str_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Trying to init CABAC when not byte aligned\n");
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

int h264_cabac_init_arith (struct bitstream *str, struct h264_cabac_context *cabac) {
	if (!cabac)
		return 0;
	if (str->bitpos != 7) {
		fprintf (stderr, "Trying to init CABAC when not byte aligned\n");
		return 1;
	}
	if (str->dir == VS_ENCODE) {
		cabac->codIRange = 510;
		cabac->codIOffset = 0;
		cabac->firstBitFlag = 1;
		cabac->bitsOutstanding = 0;
	} else {
		cabac->codIRange = 510;
		if (vs_u(str, &cabac->codIOffset, 9))
			return 1;
		if (cabac->codIOffset >= 510) {
			fprintf (stderr, "Initial codIOffset >= 510\n");
			return 1;
		}
	}
	return 0;
}